

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O1

void init_default_stack_impl_inner(void)

{
  GetStackImplementation *pGVar1;
  int iVar2;
  char *__s2;
  long lVar3;
  
  pGVar1 = get_stack_impl;
  if (get_stack_impl_inited == '\0') {
    get_stack_impl = &impl__libgcc;
    get_stack_impl_inited = '\x01';
    __s2 = TCMallocGetenvSafe("TCMALLOC_STACKTRACE_METHOD");
    pGVar1 = get_stack_impl;
    if ((__s2 != (char *)0x0) && (*__s2 != '\0')) {
      lVar3 = 0;
      while( true ) {
        pGVar1 = *(GetStackImplementation **)((long)all_impls + lVar3);
        iVar2 = strcmp(pGVar1->name,__s2);
        if (iVar2 == 0) break;
        lVar3 = lVar3 + 8;
        if (lVar3 == 0x20) {
          fprintf(_stderr,"Unknown or unsupported stacktrace method requested: %s. Ignoring it\n",
                  __s2);
          return;
        }
      }
    }
  }
  get_stack_impl = pGVar1;
  return;
}

Assistant:

static void init_default_stack_impl_inner(void) {
  if (get_stack_impl_inited) {
    return;
  }
  get_stack_impl = all_impls[0];
  get_stack_impl_inited = true;
  const char *val = TCMallocGetenvSafe("TCMALLOC_STACKTRACE_METHOD");
  if (!val || !*val) {
    // If no explicit implementation is requested, consider changing
    // libunwind->generic_fp in some cases.
    maybe_convert_libunwind_to_generic_fp();
    return;
  }
  for (int i = 0; i < sizeof(all_impls) / sizeof(all_impls[0]); i++) {
    GetStackImplementation *c = all_impls[i];
    if (strcmp(c->name, val) == 0) {
      get_stack_impl = c;
      return;
    }
  }
  fprintf(stderr, "Unknown or unsupported stacktrace method requested: %s. Ignoring it\n", val);
}